

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

int AF_A_FaceMaster(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  AActor *other;
  AActor *self;
  char *__assertion;
  int flags;
  double local_68;
  void *local_60;
  void *local_58;
  void *local_50;
  void *local_48;
  DAngle local_40;
  DAngle local_38;
  DAngle local_30;
  DAngle local_28;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00498dd8;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_00498dc8;
  self = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_00498af4;
    bVar2 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00498dd8;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_00498dc8;
LAB_00498af4:
    self = (AActor *)0x0;
  }
  local_48 = (void *)0x4070e00000000000;
  flags = 0;
  if (numparam == 1) {
LAB_00498b92:
    local_50 = (void *)0x0;
  }
  else {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_00498dc8:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_00498dd8;
      }
      this = (DObject *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if ((this != (DObject *)0x0) &&
           (bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar2)) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00498dd8;
        }
      }
      else if (this != (DObject *)0x0) goto LAB_00498dc8;
    }
    if ((uint)numparam < 3) goto LAB_00498b92;
    VVar1 = param[2].field_0.field_3.Type;
    if ((VVar1 != 0xff) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_00498dd8:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                    ,0xb93,"int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if (numparam == 3) goto LAB_00498b92;
    VVar1 = param[3].field_0.field_3.Type;
    if (VVar1 == '\x01') {
      local_50 = param[3].field_0.field_1.a;
    }
    else {
      local_50 = (void *)0x0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                      ,0xb94,"int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
    if (4 < (uint)numparam) {
      VVar1 = param[4].field_0.field_3.Type;
      if (VVar1 == '\x01') {
        local_48 = param[4].field_0.field_1.a;
      }
      else {
        if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                        ,0xb95,
                        "int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        local_48 = (void *)0x4070e00000000000;
      }
      if (numparam != 5) {
        VVar1 = param[5].field_0.field_3.Type;
        if (VVar1 == '\x01') {
          local_58 = param[5].field_0.field_1.a;
        }
        else {
          local_58 = (void *)0x0;
          if (VVar1 != 0xff) {
            __assert_fail("param[paramnum].Type == REGT_FLOAT",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                          ,0xb96,
                          "int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
          }
        }
        if ((uint)numparam < 7) {
          local_68 = 0.0;
          local_60 = (void *)0x0;
          flags = 0;
        }
        else {
          VVar1 = param[6].field_0.field_3.Type;
          if (VVar1 == '\x01') {
            local_60 = param[6].field_0.field_1.a;
          }
          else {
            local_60 = (void *)0x0;
            if (VVar1 != 0xff) {
              __assert_fail("param[paramnum].Type == REGT_FLOAT",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                            ,0xb97,
                            "int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
            }
          }
          if (numparam != 7) {
            VVar1 = param[7].field_0.field_3.Type;
            if (VVar1 == '\0') {
              flags = param[7].field_0.i;
            }
            else {
              flags = 0;
              if (VVar1 != 0xff) {
                __assert_fail("param[paramnum].Type == REGT_INT",
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                              ,0xb98,
                              "int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                             );
              }
            }
            if (8 < (uint)numparam) {
              VVar1 = param[8].field_0.field_3.Type;
              if (VVar1 == '\x01') {
                local_68 = param[8].field_0.f;
              }
              else {
                local_68 = 0.0;
                if (VVar1 != 0xff) {
                  __assert_fail("param[paramnum].Type == REGT_FLOAT",
                                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                                ,0xb99,
                                "int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                               );
                }
              }
              goto LAB_00498bad;
            }
          }
          local_68 = 0.0;
        }
        goto LAB_00498bad;
      }
    }
  }
  local_58 = (void *)0x0;
  local_68 = 0.0;
  local_60 = (void *)0x0;
LAB_00498bad:
  other = GC::ReadBarrier<AActor>((AActor **)&self->master);
  local_28.Degrees = (double)local_50;
  local_30.Degrees = (double)local_48;
  local_38.Degrees = (double)local_58;
  local_40.Degrees = (double)local_60;
  A_Face(self,other,&local_28,&local_30,&local_38,&local_40,flags,local_68);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_FaceMaster)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_ANGLE_OPT(max_turn) { max_turn = 0.; }
	PARAM_ANGLE_OPT(max_pitch) { max_pitch = 270.; }
	PARAM_ANGLE_OPT(ang_offset) { ang_offset = 0.; }
	PARAM_ANGLE_OPT(pitch_offset) { pitch_offset = 0.; }
	PARAM_INT_OPT(flags) { flags = 0; }
	PARAM_FLOAT_OPT(z_add) { z_add = 0; }

	A_Face(self, self->master, max_turn, max_pitch, ang_offset, pitch_offset, flags, z_add);
	return 0;
}